

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_dpb.c
# Opt level: O0

void h264e_dpb_dump_listX(H264eDpbFrm **list,RK_S32 count)

{
  EncFrmStatus *pEVar1;
  char *local_78;
  char *local_60;
  EncFrmStatus *status;
  H264eDpbFrm *frm;
  RK_S32 i;
  RK_S32 count_local;
  H264eDpbFrm **list_local;
  
  for (frm._0_4_ = 0; (int)(uint)frm < count; frm._0_4_ = (uint)frm + 1) {
    pEVar1 = &list[(int)(uint)frm]->status;
    if ((pEVar1->val >> 4 & 1) == 0) {
      local_60 = "P";
      if ((pEVar1->val >> 6 & 1) != 0) {
        local_60 = "p";
      }
    }
    else {
      local_60 = "i";
      if ((pEVar1->val >> 5 & 1) != 0) {
        local_60 = "I";
      }
    }
    if ((pEVar1->val >> 6 & 1) == 0) {
      local_78 = "st";
      if ((pEVar1->val >> 7 & 1) != 0) {
        local_78 = "lt";
      }
    }
    else {
      local_78 = "non";
    }
    _mpp_log_l(4,"h264e_dpb","frm  %2d   %d  %-3d %s    %-3d %-3s %-3d %-4x %-3d\n",
               "h264e_dpb_dump_listX",(ulong)(uint)frm,
               (ulong)(list[(int)(uint)frm]->field_2).on_used,(uint)(ushort)(pEVar1->val >> 0x30),
               local_60,(uint)(pEVar1->val >> 0xc) & 0xf,local_78,(uint)(pEVar1->val >> 8) & 0xf,
               (uint)(pEVar1->val >> 0x10) & 0x3f,(int)(char)((pEVar1->val << 0x22) >> 0x38));
  }
  return;
}

Assistant:

void h264e_dpb_dump_listX(H264eDpbFrm **list, RK_S32 count)
{
    RK_S32 i;

    for (i = 0; i < count; i++) {
        H264eDpbFrm *frm = list[i];
        EncFrmStatus *status = &frm->status;

        mpp_log_f("frm  %2d   %d  %-3d %s    %-3d %-3s %-3d %-4x %-3d\n",
                  i, frm->on_used, status->seq_idx,
                  (status->is_intra) ? (status->is_idr ? "I" : "i" ) :
                      status->is_non_ref ? "p" : "P",
                      status->temporal_id,
                      status->is_non_ref ? "non" : status->is_lt_ref ? "lt" : "st",
                      status->lt_idx,
                      status->ref_mode,
                      status->ref_arg);
    }
}